

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O3

VkDescriptorSetLayout __thiscall
vkt::image::anon_unknown_0::BufferLoadStoreTestInstance::prepareDescriptors
          (BufferLoadStoreTestInstance *this)

{
  Move<vk::Handle<(vk::HandleType)19>_> *pMVar1;
  VkDescriptorSetLayout obj;
  VkDescriptorPool obj_00;
  void *pvVar2;
  DeviceInterface *pDVar3;
  VkBufferView VVar4;
  Handle<(vk::HandleType)12> HVar5;
  VkDevice pVVar6;
  VkAllocationCallbacks *pVVar7;
  Handle<(vk::HandleType)19> HVar8;
  DeviceInterface *vk;
  VkDevice device;
  DescriptorSetLayoutBuilder *pDVar9;
  DescriptorPoolBuilder *pDVar10;
  Move<vk::Handle<(vk::HandleType)12>_> local_b8;
  Move<vk::Handle<(vk::HandleType)19>_> local_98;
  DescriptorSetLayoutBuilder local_78;
  
  vk = Context::getDeviceInterface
                 ((this->super_LoadStoreTestInstance).super_BaseTestInstance.super_TestInstance.
                  m_context);
  device = Context::getDevice((this->super_LoadStoreTestInstance).super_BaseTestInstance.
                              super_TestInstance.m_context);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_78);
  pDVar9 = ::vk::DescriptorSetLayoutBuilder::addBinding
                     (&local_78,VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,1,0x20,(VkSampler *)0x0);
  pDVar9 = ::vk::DescriptorSetLayoutBuilder::addBinding
                     (pDVar9,VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,1,0x20,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build(&local_98,pDVar9,vk,device,0);
  pVVar7 = local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator;
  pVVar6 = local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device;
  pDVar3 = local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface;
  HVar8.m_internal =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal = 0;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pMVar1 = &this->m_descriptorSetLayout;
  obj.m_internal =
       (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
       m_internal;
  if (obj.m_internal == 0) {
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_device = pVVar6;
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_allocator = pVVar7;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
         HVar8.m_internal;
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_deviceIface = pDVar3;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
                deleter,obj);
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_device = local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_allocator = local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator
    ;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
         local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_deviceIface =
         local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface;
    if (local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                (&local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter,
                 (VkDescriptorSetLayout)
                 local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal);
    }
  }
  local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal = 0;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (local_78.m_immutableSamplers.
      super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.m_immutableSamplers.
                    super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.m_immutableSamplerInfos.
      super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.m_immutableSamplerInfos.
                    super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.m_bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.m_bindings.
                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_98);
  pDVar10 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&local_98,VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,1)
  ;
  pDVar10 = ::vk::DescriptorPoolBuilder::addType(pDVar10,VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&local_b8,pDVar10,vk,device,1,1);
  pVVar7 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
  pVVar6 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
  pDVar3 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface;
  HVar5.m_internal =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
  local_78.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface
  ;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal = 0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_00.m_internal =
       (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  if (obj_00.m_internal == 0) {
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device
         = pVVar6;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_allocator = pVVar7;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal
         = HVar5.m_internal;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_deviceIface = pDVar3;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                deleter,obj_00);
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device
         = (VkDevice)
           local_78.m_bindings.
           super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)
                  local_78.m_immutableSamplerInfos.
                  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal
         = (deUint64)
           local_78.m_bindings.
           super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
           ._M_impl.super__Vector_impl_data._M_start;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_deviceIface =
         (DeviceInterface *)
         local_78.m_bindings.
         super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)21>_> *)
                 &local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter,
                 (VkDescriptorPool)
                 local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal);
    }
  }
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal = 0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if ((void *)local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal !=
      (void *)0x0) {
    operator_delete((void *)local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
                            m_internal,
                    (long)local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
                          m_device -
                    local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal
                   );
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&local_b8,vk,device,
                    (VkDescriptorPool)
                    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                    object.m_internal,
                    (VkDescriptorSetLayout)
                    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.
                    m_data.object.m_internal);
  pVVar7 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
  pVVar6 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
  pDVar3 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface;
  HVar5.m_internal =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
  local_78.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface
  ;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal = 0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pvVar2 = (void *)(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                   object.m_internal;
  if (pvVar2 == (void *)0x0) {
    (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
         pVVar6;
    (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
    m_internal = (deUint64)pVVar7;
    (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal
         = HVar5.m_internal;
    (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
    m_deviceIface = pDVar3;
  }
  else {
    pDVar3 = (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_deviceIface;
    local_98.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal =
         (deUint64)pvVar2;
    (*pDVar3->_vptr_DeviceInterface[0x3d])
              (pDVar3,(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                      deleter.m_device,
               (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter
               .m_pool.m_internal,1);
    *(undefined4 *)
     &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device
         = local_78.m_bindings.
           super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
    *(undefined4 *)
     ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_device + 4) =
         local_78.m_bindings.
         super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    *(undefined4 *)
     &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
      m_internal = local_78.m_immutableSamplerInfos.
                   super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start._0_4_;
    *(undefined4 *)
     ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_pool.m_internal + 4) =
         local_78.m_immutableSamplerInfos.
         super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
         ._M_impl.super__Vector_impl_data._M_start._4_4_;
    *(undefined4 *)
     &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
      m_internal = local_78.m_bindings.
                   super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                   ._M_impl.super__Vector_impl_data._M_start._0_4_;
    *(undefined4 *)
     ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
             m_internal + 4) =
         local_78.m_bindings.
         super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
         ._M_impl.super__Vector_impl_data._M_start._4_4_;
    *(undefined4 *)
     &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
      m_deviceIface =
         local_78.m_bindings.
         super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_4_;
    *(undefined4 *)
     ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_deviceIface + 4) =
         local_78.m_bindings.
         super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
         ._M_impl.super__Vector_impl_data._M_finish._4_4_;
    if ((pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal !=
        (pointer)0x0) {
      local_78.m_bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal
      ;
      (*(local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface)->
        _vptr_DeviceInterface[0x3d])
                (local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.
                 m_deviceIface,
                 local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device,
                 local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator,
                 1);
    }
  }
  makeBufferView(&local_b8,vk,device,
                 (VkBuffer)
                 (((this->super_LoadStoreTestInstance).m_imageBuffer.
                   super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                   m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                 object.m_internal,
                 (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_format,0,
                 (this->super_LoadStoreTestInstance).m_imageSizeBytes);
  pVVar7 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
  pVVar6 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
  pDVar3 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface;
  HVar5.m_internal =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
  local_78.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface
  ;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal = 0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  VVar4.m_internal =
       (this->m_bufferViewSrc).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.
       m_internal;
  if (VVar4.m_internal == 0) {
    (this->m_bufferViewSrc).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device =
         pVVar6;
    (this->m_bufferViewSrc).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.
    m_allocator = pVVar7;
    (this->m_bufferViewSrc).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal
         = HVar5.m_internal;
    (this->m_bufferViewSrc).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.
    m_deviceIface = pDVar3;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
              (&(this->m_bufferViewSrc).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.
                deleter,VVar4);
    (this->m_bufferViewSrc).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device =
         (VkDevice)
         local_78.m_bindings.
         super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_bufferViewSrc).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)
                  local_78.m_immutableSamplerInfos.
                  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (this->m_bufferViewSrc).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal
         = (deUint64)
           local_78.m_bindings.
           super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
           ._M_impl.super__Vector_impl_data._M_start;
    (this->m_bufferViewSrc).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.
    m_deviceIface =
         (DeviceInterface *)
         local_78.m_bindings.
         super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
                (&local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter,
                 (VkBufferView)
                 local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal);
    }
  }
  makeBufferView(&local_b8,vk,device,
                 (VkBuffer)
                 (((this->m_imageBufferDst).
                   super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                   m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                 object.m_internal,
                 (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_format,0,
                 (this->super_LoadStoreTestInstance).m_imageSizeBytes);
  pVVar7 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
  pVVar6 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
  pDVar3 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface;
  HVar5.m_internal =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
  local_78.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface
  ;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal = 0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  VVar4.m_internal =
       (this->m_bufferViewDst).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.
       m_internal;
  if (VVar4.m_internal == 0) {
    (this->m_bufferViewDst).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device =
         pVVar6;
    (this->m_bufferViewDst).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.
    m_allocator = pVVar7;
    (this->m_bufferViewDst).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal
         = HVar5.m_internal;
    (this->m_bufferViewDst).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.
    m_deviceIface = pDVar3;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
              (&(this->m_bufferViewDst).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.
                deleter,VVar4);
    (this->m_bufferViewDst).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device =
         (VkDevice)
         local_78.m_bindings.
         super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_bufferViewDst).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)
                  local_78.m_immutableSamplerInfos.
                  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (this->m_bufferViewDst).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal
         = (deUint64)
           local_78.m_bindings.
           super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
           ._M_impl.super__Vector_impl_data._M_start;
    (this->m_bufferViewDst).super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.
    m_deviceIface =
         (DeviceInterface *)
         local_78.m_bindings.
         super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
                (&local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter,
                 (VkBufferView)
                 local_b8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal);
    }
  }
  return (VkDescriptorSetLayout)
         (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal;
}

Assistant:

VkDescriptorSetLayout BufferLoadStoreTestInstance::prepareDescriptors (void)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();

	m_descriptorSetLayout = DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device);

	m_descriptorPool = DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

	m_descriptorSet = makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout);
	m_bufferViewSrc = makeBufferView(vk, device, m_imageBuffer->get(), m_format, 0ull, m_imageSizeBytes);
	m_bufferViewDst = makeBufferView(vk, device, m_imageBufferDst->get(), m_format, 0ull, m_imageSizeBytes);

	return *m_descriptorSetLayout;  // not passing the ownership
}